

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in_00;
  bool bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  uchar in;
  char encoded [4];
  dynbuf d;
  byte local_55;
  char local_54 [4];
  dynbuf local_50;
  
  if (inlength < 0) {
    return (char *)0x0;
  }
  Curl_dyn_init(&local_50,8000000);
  if (inlength == 0) {
    sVar4 = strlen(string);
  }
  else {
    sVar4 = (size_t)(uint)inlength;
  }
  if (sVar4 == 0) {
    pcVar5 = (*Curl_cstrdup)("");
  }
  else {
    lVar6 = sVar4 + 1;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        pcVar5 = Curl_dyn_ptr(&local_50);
        return pcVar5;
      }
      in_00 = *string;
      local_55 = in_00;
      _Var2 = Curl_isunreserved(in_00);
      if (_Var2) {
        CVar3 = Curl_dyn_addn(&local_50,&local_55,1);
        if (CVar3 == CURLE_OK) {
LAB_001153a4:
          string = (char *)((byte *)string + 1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
        curl_msnprintf(local_54,4,"%%%02X",(ulong)in_00);
        CVar3 = Curl_dyn_add(&local_50,local_54);
        if (CVar3 == CURLE_OK) goto LAB_001153a4;
      }
    } while (bVar1);
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  CURLcode result;
  struct dynbuf d;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      char encoded[4];
      result = Curl_convert_to_network(data, (char *)&in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        Curl_dyn_free(&d);
        return NULL;
      }

      msnprintf(encoded, sizeof(encoded), "%%%02X", in);
      if(Curl_dyn_add(&d, encoded))
        return NULL;
    }
    string++;
  }

  return Curl_dyn_ptr(&d);
}